

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O0

void __thiscall
KDReports::AbstractTableElement::AbstractTableElement
          (AbstractTableElement *this,AbstractTableElement *other)

{
  AbstractTableElementPrivate *this_00;
  type pAVar1;
  AbstractTableElement *other_local;
  AbstractTableElement *this_local;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__AbstractTableElement_001c82d0;
  this_00 = (AbstractTableElementPrivate *)operator_new(0x58);
  pAVar1 = std::
           unique_ptr<KDReports::AbstractTableElementPrivate,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
           ::operator*(&other->d);
  AbstractTableElementPrivate::AbstractTableElementPrivate(this_00,pAVar1);
  std::
  unique_ptr<KDReports::AbstractTableElementPrivate,std::default_delete<KDReports::AbstractTableElementPrivate>>
  ::unique_ptr<std::default_delete<KDReports::AbstractTableElementPrivate>,void>
            ((unique_ptr<KDReports::AbstractTableElementPrivate,std::default_delete<KDReports::AbstractTableElementPrivate>>
              *)&this->d,this_00);
  return;
}

Assistant:

KDReports::AbstractTableElement::AbstractTableElement(const AbstractTableElement &other)
    : Element(other)
    , d(new AbstractTableElementPrivate(*other.d))
{
}